

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

CURLcode checkpasswd(char *kind,size_t i,_Bool last,char **userpwd)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  CURLcode CVar6;
  char prompt [256];
  char passwd [256];
  
  pcVar5 = *userpwd;
  CVar6 = CURLE_OK;
  if (pcVar5 != (char *)0x0) {
    pcVar1 = strchr(pcVar5,0x3a);
    pcVar2 = strchr(pcVar5,0x3b);
    if ((pcVar1 == (char *)0x0) && (CVar6 = CURLE_OK, *pcVar5 != ';')) {
      memset(passwd,0,0x100);
      sVar3 = strlen(pcVar5);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      if (last && i == 0) {
        curl_msnprintf(prompt,0x100,"Enter %s password for user \'%s\':",kind,*userpwd);
      }
      else {
        curl_msnprintf(prompt,0x100,"Enter %s password for user \'%s\' on URL #%lu:",kind,*userpwd,
                       i + 1);
      }
      getpass_r(prompt,passwd,0x100);
      sVar4 = strlen(passwd);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = ';';
      }
      pcVar5 = (char *)realloc(*userpwd,sVar3 + sVar4 + 2);
      if (pcVar5 == (char *)0x0) {
        CVar6 = CURLE_OUT_OF_MEMORY;
      }
      else {
        pcVar5[sVar3] = ':';
        memcpy(pcVar5 + sVar3 + 1,passwd,sVar4 + 1);
        *userpwd = pcVar5;
        CVar6 = CURLE_OK;
      }
    }
  }
  return CVar6;
}

Assistant:

static CURLcode checkpasswd(const char *kind, /* for what purpose */
                            const size_t i,   /* operation index */
                            const bool last,  /* TRUE if last operation */
                            char **userpwd)   /* pointer to allocated string */
{
  char *psep;
  char *osep;

  if(!*userpwd)
    return CURLE_OK;

  /* Attempt to find the password separator */
  psep = strchr(*userpwd, ':');

  /* Attempt to find the options separator */
  osep = strchr(*userpwd, ';');

  if(!psep && **userpwd != ';') {
    /* no password present, prompt for one */
    char passwd[256] = "";
    char prompt[256];
    size_t passwdlen;
    size_t userlen = strlen(*userpwd);
    char *passptr;

    if(osep)
      *osep = '\0';

    /* build a nice-looking prompt */
    if(!i && last)
      curlx_msnprintf(prompt, sizeof(prompt),
                      "Enter %s password for user '%s':",
                      kind, *userpwd);
    else
      curlx_msnprintf(prompt, sizeof(prompt),
                      "Enter %s password for user '%s' on URL #%"
                      CURL_FORMAT_CURL_OFF_TU ":",
                      kind, *userpwd, (curl_off_t) (i + 1));

    /* get password */
    getpass_r(prompt, passwd, sizeof(passwd));
    passwdlen = strlen(passwd);

    if(osep)
      *osep = ';';

    /* extend the allocated memory area to fit the password too */
    passptr = realloc(*userpwd,
                      passwdlen + 1 + /* an extra for the colon */
                      userlen + 1);   /* an extra for the zero */
    if(!passptr)
      return CURLE_OUT_OF_MEMORY;

    /* append the password separated with a colon */
    passptr[userlen] = ':';
    memcpy(&passptr[userlen + 1], passwd, passwdlen + 1);
    *userpwd = passptr;
  }

  return CURLE_OK;
}